

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

basic_ostream<char,_std::char_traits<char>_> * __thiscall
pstore::dump::array::writer<std::ostream>
          (array *this,basic_ostream<char,_std::char_traits<char>_> *os,indent *ind)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  value_ptr *value_2;
  pointer psVar5;
  value_ptr *value;
  char *pcVar6;
  char local_39;
  int local_38;
  undefined4 local_34;
  
  psVar5 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (psVar1 == psVar5) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
      psVar5 = (this->values_).
               super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (this->values_).
               super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar5 != psVar1) {
        pcVar6 = " ";
        do {
          sVar4 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar4);
          peVar2 = (psVar5->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_34 = 0;
          (*peVar2->_vptr_value[0x15])(peVar2,os,&local_34);
          psVar5 = psVar5 + 1;
          pcVar6 = ", ";
        } while (psVar5 != psVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
      return os;
    }
    iVar3 = (*((psVar5->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->_vptr_value[0x12])();
    if ((char)iVar3 == '\0') break;
    psVar5 = psVar5 + 1;
  }
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_39,1);
  psVar5 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->values_).
           super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == psVar1) {
    return os;
  }
  pcVar6 = "";
  do {
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar4);
    dump::operator<<(os,ind);
    std::__ostream_insert<char,std::char_traits<char>>(os,"- ",2);
    peVar2 = (psVar5->super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar3 = (*peVar2->_vptr_value[2])(peVar2);
    local_38 = ind->count_ + 2 + (uint)(CONCAT44(extraout_var,iVar3) == 0) * 2;
    (*peVar2->_vptr_value[0x15])(peVar2,os,&local_38);
    psVar5 = psVar5 + 1;
    pcVar6 = "\n";
  } while (psVar5 != psVar1);
  return os;
}

Assistant:

OStream & array::writer (OStream & os, indent const & ind) const {
            char const * sep = "";

            bool const is_compact = values_.size () == 0 || this->is_number_array ();
            if (is_compact) {
                os << "[";
                sep = " ";
                for (value_ptr const & value : values_) {
                    os << sep;
                    value->write_impl (os, indent ());
                    sep = ", ";
                }
                os << " ]";
            } else {
                os << '\n';
                for (value_ptr const & value : values_) {
                    os << sep << ind << "- ";
                    value->write_impl (os,
                                       ind.next (value->dynamic_cast_object () == nullptr ? 4 : 2));
                    sep = "\n";
                }
            }
            return os;
        }